

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError6::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError6 *this,uint n_program_object)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  string local_3a0 [36];
  int local_37c;
  string local_378 [4];
  GLint gl_max_patch_vertices_value;
  string tc_code_layout_qualifier_string;
  stringstream local_348 [8];
  stringstream tc_code_layout_qualifier_sstream;
  ostream local_338;
  char *local_1c0;
  char *tc_code_body_excl_layout_qualifiers;
  char *tc_code_preamble;
  stringstream result;
  ostream local_1a0;
  long local_28;
  Functions *gl;
  TessellationShaderError6 *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError6 *this_local;
  
  gl._4_4_ = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError6 *)__return_storage_ptr__;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.
                      m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::stringstream::stringstream((stringstream *)&tc_code_preamble);
  tc_code_body_excl_layout_qualifiers = "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\n";
  local_1c0 = 
  "\nin vec4 test_input[];\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = test_input[0];\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n}\n"
  ;
  std::__cxx11::stringstream::stringstream(local_348);
  std::__cxx11::string::string(local_378);
  if (gl._4_4_ == 0) {
    std::__cxx11::string::operator=(local_378,"layout (vertices = 0) out;\n");
  }
  else {
    local_37c = 0;
    (**(code **)(local_28 + 0x868))
              ((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.m_glExtTokens.
               MAX_PATCH_VERTICES,&local_37c);
    err = (**(code **)(local_28 + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderErrors.cpp"
                    ,0x77b);
    poVar3 = std::operator<<(&local_338,"layout (vertices = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_37c + 1);
    std::operator<<(poVar3,") out;\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_378,local_3a0);
    std::__cxx11::string::~string(local_3a0);
  }
  poVar3 = std::operator<<(&local_1a0,tc_code_body_excl_layout_qualifiers);
  poVar3 = std::operator<<(poVar3,local_378);
  std::operator<<(poVar3,local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_378);
  std::__cxx11::stringstream::~stringstream(local_348);
  std::__cxx11::stringstream::~stringstream((stringstream *)&tc_code_preamble);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError6::getTessellationControlShaderCode(unsigned int n_program_object)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 result;
	const char*			  tc_code_preamble = "${VERSION}\n"
								   "\n"
								   "${TESSELLATION_SHADER_REQUIRE}\n"
								   "\n";
	const char* tc_code_body_excl_layout_qualifiers = "\n"
													  "in vec4 test_input[];\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    gl_out[gl_InvocationID].gl_Position = test_input[0];\n"
													  "    gl_TessLevelOuter[0]                = 1.0;\n"
													  "    gl_TessLevelOuter[1]                = 1.0;\n"
													  "}\n";

	/* Prepare the line with layout qualifier */
	std::stringstream tc_code_layout_qualifier_sstream;
	std::string		  tc_code_layout_qualifier_string;

	if (n_program_object == 0)
	{
		tc_code_layout_qualifier_string = "layout (vertices = 0) out;\n";
	}
	else
	{
		/* Retrieve GL_MAX_PATCH_VERTICES_EXT value first */
		glw::GLint gl_max_patch_vertices_value = 0;

		gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

		/* Construct the string */
		tc_code_layout_qualifier_sstream << "layout (vertices = " << (gl_max_patch_vertices_value + 1) << ") out;\n";

		tc_code_layout_qualifier_string = tc_code_layout_qualifier_sstream.str();
	}

	result << tc_code_preamble << tc_code_layout_qualifier_string << tc_code_body_excl_layout_qualifiers;

	return result.str();
}